

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86.cpp
# Opt level: O3

int __thiscall ncnn::Swish_x86::forward_inplace(Swish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  float *pfVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar13 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar8 = 0;
    do {
      pfVar9 = (float *)(bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                        (long)bottom_top_blob->data);
      if ((int)uVar7 < 4) {
        uVar6 = 0;
      }
      else {
        iVar5 = 3;
        do {
          fVar1 = pfVar9[2];
          fVar11 = pfVar9[3];
          auVar21._0_8_ = *(ulong *)pfVar9 ^ 0x8000000080000000;
          auVar21._8_4_ = -fVar1;
          auVar21._12_4_ = -fVar11;
          auVar3._8_4_ = 0x42b0c0a5;
          auVar3._0_8_ = 0x42b0c0a542b0c0a5;
          auVar3._12_4_ = 0x42b0c0a5;
          auVar22 = minps(auVar21,auVar3);
          auVar4._8_4_ = 0xc2b0c0a5;
          auVar4._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar4._12_4_ = 0xc2b0c0a5;
          auVar22 = maxps(auVar22,auVar4);
          fVar12 = auVar22._0_4_ * 1.442695 + 0.5;
          fVar14 = auVar22._4_4_ * 1.442695 + 0.5;
          fVar15 = auVar22._8_4_ * 1.442695 + 0.5;
          fVar16 = auVar22._12_4_ * 1.442695 + 0.5;
          fVar17 = (float)(int)fVar12;
          fVar18 = (float)(int)fVar14;
          fVar19 = (float)(int)fVar15;
          fVar20 = (float)(int)fVar16;
          fVar17 = fVar17 - (float)(-(uint)(fVar12 < fVar17) & 0x3f800000);
          fVar18 = fVar18 - (float)(-(uint)(fVar14 < fVar18) & 0x3f800000);
          fVar19 = fVar19 - (float)(-(uint)(fVar15 < fVar19) & 0x3f800000);
          fVar20 = fVar20 - (float)(-(uint)(fVar16 < fVar20) & 0x3f800000);
          fVar12 = fVar17 * -0.6931472 + auVar22._0_4_;
          fVar14 = fVar18 * -0.6931472 + auVar22._4_4_;
          fVar15 = fVar19 * -0.6931472 + auVar22._8_4_;
          fVar16 = fVar20 * -0.6931472 + auVar22._12_4_;
          auVar13._0_4_ =
               fVar12 + 1.0 +
               (((((fVar12 * 0.00019875691 + 0.0013981999) * fVar12 + 0.008333452) * fVar12 +
                 0.041665796) * fVar12 + 0.16666666) * fVar12 + 0.5) * fVar12 * fVar12;
          auVar13._4_4_ =
               fVar14 + 1.0 +
               (((((fVar14 * 0.00019875691 + 0.0013981999) * fVar14 + 0.008333452) * fVar14 +
                 0.041665796) * fVar14 + 0.16666666) * fVar14 + 0.5) * fVar14 * fVar14;
          auVar13._8_4_ =
               fVar15 + 1.0 +
               (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
                 0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5) * fVar15 * fVar15;
          auVar13._12_4_ =
               fVar16 + 1.0 +
               (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
                 0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5) * fVar16 * fVar16;
          fVar12 = (float)((int)fVar17 * 0x800000 + 0x3f800000) * auVar13._0_4_ + 1.0;
          fVar14 = (float)((int)fVar18 * 0x800000 + 0x3f800000) * auVar13._4_4_ + 1.0;
          fVar15 = (float)((int)fVar19 * 0x800000 + 0x3f800000) * auVar13._8_4_ + 1.0;
          fVar16 = (float)((int)fVar20 * 0x800000 + 0x3f800000) * auVar13._12_4_ + 1.0;
          auVar22._4_4_ = fVar14;
          auVar22._0_4_ = fVar12;
          auVar22._8_4_ = fVar15;
          auVar22._12_4_ = fVar16;
          auVar22 = rcpps(auVar13,auVar22);
          fVar17 = *pfVar9 * auVar22._0_4_;
          fVar18 = pfVar9[1] * auVar22._4_4_;
          fVar19 = fVar1 * auVar22._8_4_;
          fVar20 = fVar11 * auVar22._12_4_;
          *pfVar9 = (*pfVar9 - fVar12 * fVar17) * auVar22._0_4_ + fVar17;
          pfVar9[1] = (pfVar9[1] - fVar14 * fVar18) * auVar22._4_4_ + fVar18;
          pfVar9[2] = (fVar1 - fVar15 * fVar19) * auVar22._8_4_ + fVar19;
          pfVar9[3] = (fVar11 - fVar16 * fVar20) * auVar22._12_4_ + fVar20;
          pfVar9 = pfVar9 + 4;
          iVar5 = iVar5 + 4;
          uVar6 = uVar7 & 0xfffffffc;
        } while (iVar5 < (int)uVar7);
      }
      if (uVar7 - uVar6 != 0 && (int)uVar6 <= (int)uVar7) {
        lVar10 = 0;
        do {
          fVar1 = pfVar9[lVar10];
          fVar11 = expf(-fVar1);
          pfVar9[lVar10] = fVar1 / (fVar11 + 1.0);
          lVar10 = lVar10 + 1;
        } while (uVar7 - uVar6 != (int)lVar10);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar2);
  }
  return 0;
}

Assistant:

int Swish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_p, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_p, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_p, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + expf(-*ptr));
            ptr++;
        }
    }

    return 0;
}